

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

int get_byte(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  byte *pbVar2;
  boolean bVar3;
  jpeg_source_mgr *src;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->src;
  if ((pjVar1->bytes_in_buffer == 0) && (bVar3 = (*pjVar1->fill_input_buffer)(cinfo), bVar3 == 0)) {
    cinfo->err->msg_code = 0x19;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1->bytes_in_buffer = pjVar1->bytes_in_buffer - 1;
  pbVar2 = pjVar1->next_input_byte;
  pjVar1->next_input_byte = pbVar2 + 1;
  return (int)*pbVar2;
}

Assistant:

LOCAL(int)
get_byte (j_decompress_ptr cinfo)
/* Read next input byte; we do not support suspension in this module. */
{
  struct jpeg_source_mgr * src = cinfo->src;

  if (src->bytes_in_buffer == 0)
    if (! (*src->fill_input_buffer) (cinfo))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);
  src->bytes_in_buffer--;
  return GETJOCTET(*src->next_input_byte++);
}